

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

int CheckMemBufferMode(MemBuffer *mem,MemBufferMode expected)

{
  MemBufferMode expected_local;
  MemBuffer *mem_local;
  
  if (mem->mode_ == MEM_MODE_NONE) {
    mem->mode_ = expected;
  }
  else if (mem->mode_ != expected) {
    return 0;
  }
  return 1;
}

Assistant:

static int CheckMemBufferMode(MemBuffer* const mem, MemBufferMode expected) {
  if (mem->mode_ == MEM_MODE_NONE) {
    mem->mode_ = expected;    // switch to the expected mode
  } else if (mem->mode_ != expected) {
    return 0;         // we mixed the modes => error
  }
  assert(mem->mode_ == expected);   // mode is ok
  return 1;
}